

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  wally_psbt_input *parent;
  wally_psbt_output *parent_00;
  wally_psbt_input *pwVar1;
  wally_psbt_input *pwVar2;
  wally_tx_output *src_00;
  wally_tx_witness_stack *p;
  size_t sVar3;
  wally_psbt_output *pwVar4;
  wally_psbt_output *pwVar5;
  int iVar6;
  void *pvVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  
  lVar9 = 0;
  iVar6 = 0;
  for (uVar10 = 0; (iVar6 == 0 && (uVar10 < psbt->num_inputs)); uVar10 = uVar10 + 1) {
    pwVar1 = psbt->inputs;
    parent = (wally_psbt_input *)((long)&pwVar1->utxo + lVar9);
    pwVar2 = src->inputs;
    iVar6 = combine_txs((wally_tx **)parent,*(wally_tx **)((long)&pwVar2->utxo + lVar9));
    if ((iVar6 != 0) ||
       (((*(long *)((long)&pwVar1->witness_utxo + lVar9) == 0 &&
         (src_00 = *(wally_tx_output **)((long)&pwVar2->witness_utxo + lVar9),
         src_00 != (wally_tx_output *)0x0)) &&
        (iVar6 = wally_tx_output_clone_alloc
                           (src_00,(wally_tx_output **)((long)&pwVar1->witness_utxo + lVar9)),
        iVar6 != 0)))) goto LAB_0010650d;
    if ((*(long *)((long)&pwVar1->redeem_script + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar2->redeem_script + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar2->redeem_script_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar1->redeem_script + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_0010626d;
      }
      else {
        iVar6 = wally_psbt_input_set_redeem_script(parent,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_0010626d;
      }
      goto LAB_0010650d;
    }
LAB_0010626d:
    if ((*(long *)((long)&pwVar1->witness_script + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar2->witness_script + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar2->witness_script_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar1->witness_script + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_00106279;
      }
      else {
        iVar6 = wally_psbt_input_set_witness_script(parent,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_00106279;
      }
      goto LAB_0010650d;
    }
LAB_00106279:
    if ((*(long *)((long)&pwVar1->final_scriptsig + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar2->final_scriptsig + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar2->final_scriptsig_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar1->final_scriptsig + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_00106285;
      }
      else {
        iVar6 = wally_psbt_input_set_final_scriptsig(parent,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_00106285;
      }
    }
    else {
LAB_00106285:
      if (((((*(long *)((long)&pwVar1->final_witness + lVar9) != 0) ||
            (p = *(wally_tx_witness_stack **)((long)&pwVar2->final_witness + lVar9),
            p == (wally_tx_witness_stack *)0x0)) ||
           (iVar6 = wally_psbt_input_set_final_witness(parent,p), iVar6 == 0)) &&
          ((iVar6 = map_extend((wally_map *)((long)&(pwVar1->keypaths).items + lVar9),
                               (wally_map *)((long)&(pwVar2->keypaths).items + lVar9),
                               wally_ec_public_key_verify), iVar6 == 0 &&
           (iVar6 = map_extend((wally_map *)((long)&(pwVar1->signatures).items + lVar9),
                               (wally_map *)((long)&(pwVar2->signatures).items + lVar9),
                               wally_ec_public_key_verify), iVar6 == 0)))) &&
         (iVar6 = map_extend((wally_map *)((long)&(pwVar1->unknowns).items + lVar9),
                             (wally_map *)((long)&(pwVar2->unknowns).items + lVar9),
                             (_func_int_uchar_ptr_size_t *)0x0), iVar6 == 0)) {
        if ((*(int *)((long)&pwVar1->sighash + lVar9) == 0) &&
           (iVar6 = *(int *)((long)&pwVar2->sighash + lVar9), iVar6 != 0)) {
          *(int *)((long)&pwVar1->sighash + lVar9) = iVar6;
        }
        if ((*(int *)((long)&pwVar1->has_value + lVar9) == 0) &&
           (*(int *)((long)&pwVar2->has_value + lVar9) != 0)) {
          *(undefined8 *)((long)&pwVar1->value + lVar9) =
               *(undefined8 *)((long)&pwVar2->value + lVar9);
          *(undefined4 *)((long)&pwVar1->has_value + lVar9) = 1;
        }
        if ((*(long *)((long)&pwVar1->vbf + lVar9) == 0) &&
           (puVar8 = *(uchar **)((long)&pwVar2->vbf + lVar9), puVar8 != (uchar *)0x0)) {
          sVar3 = *(size_t *)((long)&pwVar2->vbf_len + lVar9);
          if (sVar3 == 0) {
            pvVar7 = wally_malloc(1);
            *(void **)((long)&pwVar1->vbf + lVar9) = pvVar7;
            iVar6 = -3;
            if (pvVar7 != (void *)0x0) goto LAB_00106468;
          }
          else {
            iVar6 = wally_psbt_input_set_vbf(parent,puVar8,sVar3);
            if (iVar6 == 0) goto LAB_00106468;
          }
        }
        else {
LAB_00106468:
          if ((*(long *)((long)&pwVar1->asset + lVar9) == 0) &&
             (puVar8 = *(uchar **)((long)&pwVar2->asset + lVar9), puVar8 != (uchar *)0x0)) {
            sVar3 = *(size_t *)((long)&pwVar2->asset_len + lVar9);
            if (sVar3 == 0) {
              pvVar7 = wally_malloc(1);
              *(void **)((long)&pwVar1->asset + lVar9) = pvVar7;
              iVar6 = -3;
              if (pvVar7 != (void *)0x0) goto LAB_00106477;
            }
            else {
              iVar6 = wally_psbt_input_set_asset(parent,puVar8,sVar3);
              if (iVar6 == 0) goto LAB_00106477;
            }
          }
          else {
LAB_00106477:
            if ((*(long *)((long)&pwVar1->abf + lVar9) == 0) &&
               (puVar8 = *(uchar **)((long)&pwVar2->abf + lVar9), puVar8 != (uchar *)0x0)) {
              sVar3 = *(size_t *)((long)&pwVar2->abf_len + lVar9);
              if (sVar3 == 0) {
                pvVar7 = wally_malloc(1);
                *(void **)((long)&pwVar1->abf + lVar9) = pvVar7;
                iVar6 = -3;
                if (pvVar7 != (void *)0x0) goto LAB_00106486;
              }
              else {
                iVar6 = wally_psbt_input_set_abf(parent,puVar8,sVar3);
                if (iVar6 == 0) goto LAB_00106486;
              }
            }
            else {
LAB_00106486:
              iVar6 = combine_txs((wally_tx **)((long)&pwVar1->pegin_tx + lVar9),
                                  *(wally_tx **)((long)&pwVar2->pegin_tx + lVar9));
              if (iVar6 == 0) {
                if ((*(long *)((long)&pwVar1->txoutproof + lVar9) == 0) &&
                   (puVar8 = *(uchar **)((long)&pwVar2->txoutproof + lVar9), puVar8 != (uchar *)0x0)
                   ) {
                  sVar3 = *(size_t *)((long)&pwVar2->txoutproof_len + lVar9);
                  if (sVar3 == 0) {
                    pvVar7 = wally_malloc(1);
                    *(void **)((long)&pwVar1->txoutproof + lVar9) = pvVar7;
                    iVar6 = -3;
                    if (pvVar7 != (void *)0x0) goto LAB_001064b1;
                  }
                  else {
                    iVar6 = wally_psbt_input_set_txoutproof(parent,puVar8,sVar3);
                    if (iVar6 == 0) goto LAB_001064b1;
                  }
                }
                else {
LAB_001064b1:
                  if ((*(long *)((long)&pwVar1->genesis_blockhash + lVar9) == 0) &&
                     (puVar8 = *(uchar **)((long)&pwVar2->genesis_blockhash + lVar9),
                     puVar8 != (uchar *)0x0)) {
                    sVar3 = *(size_t *)((long)&pwVar2->genesis_blockhash_len + lVar9);
                    if (sVar3 == 0) {
                      pvVar7 = wally_malloc(1);
                      *(void **)((long)&pwVar1->genesis_blockhash + lVar9) = pvVar7;
                      iVar6 = -3;
                      if (pvVar7 != (void *)0x0) goto LAB_001064c0;
                    }
                    else {
                      iVar6 = wally_psbt_input_set_genesis_blockhash(parent,puVar8,sVar3);
                      if (iVar6 == 0) goto LAB_001064c0;
                    }
                  }
                  else {
LAB_001064c0:
                    if ((*(long *)((long)&pwVar1->claim_script + lVar9) == 0) &&
                       (puVar8 = *(uchar **)((long)&pwVar2->claim_script + lVar9),
                       puVar8 != (uchar *)0x0)) {
                      sVar3 = *(size_t *)((long)&pwVar2->claim_script_len + lVar9);
                      if (sVar3 == 0) {
                        pvVar7 = wally_malloc(1);
                        *(void **)((long)&pwVar1->claim_script + lVar9) = pvVar7;
                        iVar6 = -3;
                        if (pvVar7 != (void *)0x0) goto LAB_001064cf;
                      }
                      else {
                        iVar6 = wally_psbt_input_set_claim_script(parent,puVar8,sVar3);
                        if (iVar6 == 0) goto LAB_001064cf;
                      }
                    }
                    else {
LAB_001064cf:
                      iVar6 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010650d:
    lVar9 = lVar9 + 0x110;
  }
  lVar9 = 0;
  uVar10 = 0;
  do {
    if (iVar6 != 0) {
      return iVar6;
    }
    if (psbt->num_outputs <= uVar10) {
      iVar6 = map_extend(&psbt->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0);
      return iVar6;
    }
    pwVar4 = psbt->outputs;
    pwVar5 = src->outputs;
    iVar6 = map_extend((wally_map *)((long)&(pwVar4->keypaths).items + lVar9),
                       (wally_map *)((long)&(pwVar5->keypaths).items + lVar9),
                       wally_ec_public_key_verify);
    if ((iVar6 != 0) ||
       (iVar6 = map_extend((wally_map *)((long)&(pwVar4->unknowns).items + lVar9),
                           (wally_map *)((long)&(pwVar5->unknowns).items + lVar9),
                           (_func_int_uchar_ptr_size_t *)0x0), iVar6 != 0)) goto LAB_00106795;
    parent_00 = (wally_psbt_output *)((long)&pwVar4->redeem_script + lVar9);
    if ((parent_00->redeem_script == (uchar *)0x0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->redeem_script + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->redeem_script_len + lVar9);
      if (sVar3 == 0) {
        puVar8 = (uchar *)wally_malloc(1);
        parent_00->redeem_script = puVar8;
        iVar6 = -3;
        if (puVar8 != (uchar *)0x0) goto LAB_001067b0;
      }
      else {
        iVar6 = wally_psbt_output_set_redeem_script(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067b0;
      }
      goto LAB_00106795;
    }
LAB_001067b0:
    if ((*(long *)((long)&pwVar4->witness_script + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->witness_script + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->witness_script_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->witness_script + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067bc;
      }
      else {
        iVar6 = wally_psbt_output_set_witness_script(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067bc;
      }
      goto LAB_00106795;
    }
LAB_001067bc:
    if ((*(long *)((long)&pwVar4->blinding_pubkey + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->blinding_pubkey + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->blinding_pubkey_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->blinding_pubkey + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067c8;
      }
      else {
        iVar6 = wally_psbt_output_set_blinding_pubkey(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067c8;
      }
      goto LAB_00106795;
    }
LAB_001067c8:
    if ((*(long *)((long)&pwVar4->value_commitment + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->value_commitment + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->value_commitment_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->value_commitment + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067d4;
      }
      else {
        iVar6 = wally_psbt_output_set_value_commitment(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067d4;
      }
      goto LAB_00106795;
    }
LAB_001067d4:
    if ((*(long *)((long)&pwVar4->vbf + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->vbf + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->vbf_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->vbf + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067e0;
      }
      else {
        iVar6 = wally_psbt_output_set_vbf(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067e0;
      }
      goto LAB_00106795;
    }
LAB_001067e0:
    if ((*(long *)((long)&pwVar4->asset_commitment + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->asset_commitment + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->asset_commitment_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->asset_commitment + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067ef;
      }
      else {
        iVar6 = wally_psbt_output_set_asset_commitment(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067ef;
      }
      goto LAB_00106795;
    }
LAB_001067ef:
    if ((*(long *)((long)&pwVar4->abf + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->abf + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->abf_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->abf + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_001067fe;
      }
      else {
        iVar6 = wally_psbt_output_set_abf(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_001067fe;
      }
      goto LAB_00106795;
    }
LAB_001067fe:
    if ((*(long *)((long)&pwVar4->nonce + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->nonce + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->nonce_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->nonce + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_0010680d;
      }
      else {
        iVar6 = wally_psbt_output_set_nonce(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_0010680d;
      }
      goto LAB_00106795;
    }
LAB_0010680d:
    if ((*(long *)((long)&pwVar4->rangeproof + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->rangeproof + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->rangeproof_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->rangeproof + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_0010681c;
      }
      else {
        iVar6 = wally_psbt_output_set_rangeproof(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_0010681c;
      }
      goto LAB_00106795;
    }
LAB_0010681c:
    if ((*(long *)((long)&pwVar4->surjectionproof + lVar9) == 0) &&
       (puVar8 = *(uchar **)((long)&pwVar5->surjectionproof + lVar9), puVar8 != (uchar *)0x0)) {
      sVar3 = *(size_t *)((long)&pwVar5->surjectionproof_len + lVar9);
      if (sVar3 == 0) {
        pvVar7 = wally_malloc(1);
        *(void **)((long)&pwVar4->surjectionproof + lVar9) = pvVar7;
        iVar6 = -3;
        if (pvVar7 != (void *)0x0) goto LAB_0010682b;
      }
      else {
        iVar6 = wally_psbt_output_set_surjectionproof(parent_00,puVar8,sVar3);
        if (iVar6 == 0) goto LAB_0010682b;
      }
    }
    else {
LAB_0010682b:
      iVar6 = 0;
    }
LAB_00106795:
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0xd0;
  } while( true );
}

Assistant:

static int psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    size_t i;
    int ret = WALLY_OK;

    for (i = 0; ret == WALLY_OK && i < psbt->num_inputs; ++i)
        ret = combine_inputs(&psbt->inputs[i], &src->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < psbt->num_outputs; ++i)
        ret = combine_outputs(&psbt->outputs[i], &src->outputs[i]);

    if (ret == WALLY_OK)
        ret = map_extend(&psbt->unknowns, &src->unknowns, NULL);

    return ret;
}